

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O1

NodeRange __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
::
AddConstraintAndTryNoteResultVariable<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>>
          (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
           *this,AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *con)

{
  int iVar1;
  NodeRange NVar2;
  
  iVar1 = ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>>
          ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>>
                    ((ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>>
                      *)(this + 0x1510),*(int *)(this + 0xb38),con);
  if (iVar1 < 0) {
    iVar1 = *(int *)(this + 0x1568) + iVar1;
  }
  if (*(int *)(this + 0x1568) <= iVar1) {
    *(long *)(this + 0x1568) = (long)(iVar1 + 1);
  }
  NVar2.ir_.end_ = iVar1 + 1;
  NVar2.ir_.beg_ = iVar1;
  NVar2.pvn_ = (ValueNode *)(this + 0x1518);
  return NVar2;
}

Assistant:

pre::NodeRange AddConstraintAndTryNoteResultVariable(Constraint&& con) {
    const auto resvar = con.GetResultVar();
    auto& ck = GET_CONSTRAINT_KEEPER( Constraint );
    auto i = ck.AddConstraint(constr_depth_, std::move(con));
    ConInfo ci{&ck, i};
    if (resvar>=0)
      AddInitExpression(resvar, ci);
    /// Can also cache non-functional constraints,
    /// but then implement checking before
    if (! MP_DISPATCH( MapInsert(
                         MPD(template GetConstraint<Constraint>(i)), i ) ))
      MP_RAISE("Trying to MapInsert() duplicated constraint: " +
                             ck.GetDescription());
    return ck.SelectValueNodeRange(i);
  }